

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O1

void Abc_NtkInputOutputCounters
               (Abc_Ntk_t *pNtk,Vec_Int_t *vFan,Vec_Int_t *vFon,Vec_Int_t *vFanR,Vec_Int_t *vFonR)

{
  uint uVar1;
  int iVar2;
  long *plVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  void *pvVar6;
  long lVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  
  lVar7 = (long)pNtk->vCis->nSize;
  iVar13 = 0;
  iVar12 = 0;
  if (0 < lVar7) {
    lVar10 = 0;
    iVar12 = 0;
    do {
      iVar2 = *(int *)((long)pNtk->vCis->pArray[lVar10] + 0x2c);
      if (iVar2 < iVar12) {
        iVar2 = iVar12;
      }
      iVar12 = iVar2;
      lVar10 = lVar10 + 1;
    } while (lVar7 != lVar10);
  }
  lVar7 = (long)pNtk->vCos->nSize;
  if (0 < lVar7) {
    lVar10 = 0;
    iVar13 = 0;
    do {
      plVar3 = (long *)pNtk->vCos->pArray[lVar10];
      iVar2 = *(int *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                (long)*(int *)plVar3[4] * 8) + 0x1c);
      if (iVar13 <= iVar2) {
        iVar13 = iVar2;
      }
      lVar10 = lVar10 + 1;
    } while (lVar7 != lVar10);
  }
  uVar1 = iVar13 + 1;
  uVar11 = (ulong)uVar1;
  if (vFan->nCap <= iVar13) {
    if (vFan->pArray == (int *)0x0) {
      piVar8 = (int *)malloc(uVar11 * 4);
    }
    else {
      piVar8 = (int *)realloc(vFan->pArray,uVar11 * 4);
    }
    vFan->pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_0027f599;
    vFan->nCap = uVar1;
  }
  memset(vFan->pArray,0,uVar11 * 4);
  vFan->nSize = uVar1;
  uVar14 = iVar12 + 1;
  uVar9 = (ulong)uVar14;
  if (vFon->nCap <= iVar12) {
    if (vFon->pArray == (int *)0x0) {
      piVar8 = (int *)malloc(uVar9 * 4);
    }
    else {
      piVar8 = (int *)realloc(vFon->pArray,uVar9 * 4);
    }
    vFon->pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_0027f599;
    vFon->nCap = uVar14;
  }
  memset(vFon->pArray,0,uVar9 * 4);
  vFon->nSize = uVar14;
  if (vFanR->nCap <= iVar13) {
    if (vFanR->pArray == (int *)0x0) {
      piVar8 = (int *)malloc(uVar11 * 4);
    }
    else {
      piVar8 = (int *)realloc(vFanR->pArray,uVar11 * 4);
    }
    vFanR->pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_0027f599;
    vFanR->nCap = uVar1;
  }
  memset(vFanR->pArray,0,uVar11 << 2);
  vFanR->nSize = uVar1;
  if (vFonR->nCap <= iVar12) {
    if (vFonR->pArray == (int *)0x0) {
      piVar8 = (int *)malloc(uVar9 * 4);
    }
    else {
      piVar8 = (int *)realloc(vFonR->pArray,uVar9 * 4);
    }
    vFonR->pArray = piVar8;
    if (piVar8 == (int *)0x0) {
LAB_0027f599:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vFonR->nCap = uVar14;
  }
  memset(vFonR->pArray,0,uVar9 << 2);
  vFonR->nSize = uVar14;
  pVVar4 = pNtk->vCis;
  if (0 < pVVar4->nSize) {
    ppvVar5 = pVVar4->pArray;
    lVar7 = 0;
    do {
      pvVar6 = ppvVar5[lVar7];
      iVar13 = *(int *)((long)pvVar6 + 0x2c);
      lVar10 = (long)iVar13;
      if ((lVar10 < 0) || (vFon->nSize <= iVar13)) goto LAB_0027f55b;
      vFon->pArray[lVar10] = vFon->pArray[lVar10] + 1;
      if (vFonR->nSize <= iVar13) goto LAB_0027f57a;
      vFonR->pArray[lVar10] = *(int *)((long)pvVar6 + 0x10);
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar4->nSize);
  }
  pVVar4 = pNtk->vCos;
  if (0 < pVVar4->nSize) {
    ppvVar5 = pVVar4->pArray;
    lVar7 = 0;
    do {
      plVar3 = (long *)ppvVar5[lVar7];
      iVar13 = *(int *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                 (long)*(int *)plVar3[4] * 8) + 0x1c);
      lVar10 = (long)iVar13;
      if ((lVar10 < 0) || (vFan->nSize <= iVar13)) {
LAB_0027f55b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      vFan->pArray[lVar10] = vFan->pArray[lVar10] + 1;
      if (vFanR->nSize <= iVar13) {
LAB_0027f57a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vFanR->pArray[lVar10] = (int)plVar3[2];
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar4->nSize);
  }
  return;
}

Assistant:

void Abc_NtkInputOutputCounters( Abc_Ntk_t * pNtk, Vec_Int_t * vFan, Vec_Int_t * vFon, Vec_Int_t * vFanR, Vec_Int_t * vFonR )
{
    Abc_Obj_t * pNode;
    int i, nFanins, nFanouts;
    int nFaninsMax = 0, nFanoutsMax = 0;
    Abc_NtkForEachCi( pNtk, pNode, i )
        nFanoutsMax = Abc_MaxInt( nFanoutsMax, Abc_ObjFanoutNum(pNode) );
    Abc_NtkForEachCo( pNtk, pNode, i )
        nFaninsMax  = Abc_MaxInt( nFaninsMax,  Abc_ObjFaninNum(Abc_ObjFanin0(pNode)) );
    Vec_IntFill( vFan, nFaninsMax + 1, 0 );
    Vec_IntFill( vFon, nFanoutsMax + 1, 0 );
    Vec_IntFill( vFanR, nFaninsMax + 1, 0 );
    Vec_IntFill( vFonR, nFanoutsMax + 1, 0 );
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        nFanouts = Abc_ObjFanoutNum( pNode );
        Vec_IntAddToEntry( vFon, nFanouts, 1 );
        Vec_IntWriteEntry( vFonR, nFanouts, Abc_ObjId(pNode) );
    }
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        nFanins  = Abc_ObjFaninNum( Abc_ObjFanin0(pNode) );
        Vec_IntAddToEntry( vFan,  nFanins, 1 );
        Vec_IntWriteEntry( vFanR, nFanins, Abc_ObjId(pNode) );
    }
}